

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  BlockEntry *pBVar1;
  bool bVar2;
  int iVar3;
  Cluster *this_00;
  long lVar4;
  undefined4 extraout_var;
  longlong lVar5;
  Cluster *pCVar6;
  undefined4 extraout_var_00;
  Tracks *this_01;
  Tracks *tn_00;
  Track *this_02;
  long *in_RDX;
  CuePoint *in_RSI;
  undefined8 *in_RDI;
  longlong type;
  Track *pTrack;
  long tn;
  Tracks *pTracks;
  longlong tc_;
  Block *pBlock_1;
  BlockEntry *pEntry_1;
  long status_1;
  long len_1;
  longlong pos_1;
  long index;
  Block *pBlock;
  BlockEntry *pEntry;
  long status;
  long len;
  longlong pos;
  long index_1;
  long block;
  longlong tc;
  Cluster *in_stack_ffffffffffffff50;
  Block *in_stack_ffffffffffffff58;
  long local_68;
  long *in_stack_ffffffffffffffc8;
  longlong *in_stack_ffffffffffffffd0;
  BlockEntry *local_8;
  
  this_00 = (Cluster *)CuePoint::GetTimeCode(in_RSI);
  if (in_RDX[2] < 1) {
LAB_0018d070:
    local_68 = 0;
    while( true ) {
      while( true ) {
        if ((long)in_RDI[8] <= local_68) {
          lVar4 = Parse(this_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          if (lVar4 < 0) {
            return (BlockEntry *)0x0;
          }
          if (0 < lVar4) {
            return (BlockEntry *)0x0;
          }
        }
        local_8 = *(BlockEntry **)(in_RDI[6] + local_68 * 8);
        iVar3 = (*local_8->_vptr_BlockEntry[2])();
        lVar5 = Block::GetTrackNumber((Block *)CONCAT44(extraout_var_00,iVar3));
        if (lVar5 == *in_RDX) break;
        local_68 = local_68 + 1;
      }
      this_01 = (Tracks *)Block::GetTimeCode(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if ((long)this_00 <= (long)this_01) break;
      local_68 = local_68 + 1;
    }
    if ((long)this_00 < (long)this_01) {
      local_8 = (BlockEntry *)0x0;
    }
    else {
      tn_00 = Segment::GetTracks((Segment *)*in_RDI);
      this_02 = Tracks::GetTrackByNumber(this_01,(long)tn_00);
      if (this_02 == (Track *)0x0) {
        local_8 = (BlockEntry *)0x0;
      }
      else {
        lVar4 = Track::GetType(this_02);
        if (lVar4 != 2) {
          if (lVar4 == 1) {
            bVar2 = Block::IsKey((Block *)CONCAT44(extraout_var_00,iVar3));
            if (!bVar2) {
              local_8 = (BlockEntry *)0x0;
            }
          }
          else {
            local_8 = (BlockEntry *)0x0;
          }
        }
      }
    }
  }
  else {
    in_stack_ffffffffffffffd0 = (longlong *)in_RDX[2];
    in_stack_ffffffffffffffc8 = (long *)((long)in_stack_ffffffffffffffd0 + -1);
    do {
      if ((long)in_stack_ffffffffffffffc8 < (long)in_RDI[8]) {
        pBVar1 = *(BlockEntry **)(in_RDI[6] + (long)in_stack_ffffffffffffffc8 * 8);
        iVar3 = (*pBVar1->_vptr_BlockEntry[2])();
        lVar5 = Block::GetTrackNumber((Block *)CONCAT44(extraout_var,iVar3));
        if ((lVar5 == *in_RDX) &&
           (pCVar6 = (Cluster *)
                     Block::GetTimeCode(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50),
           pCVar6 == this_00)) {
          return pBVar1;
        }
        goto LAB_0018d070;
      }
      lVar4 = Parse(this_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (lVar4 < 0) {
        return (BlockEntry *)0x0;
      }
    } while (lVar4 < 1);
    local_8 = (BlockEntry *)0x0;
  }
  return local_8;
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}